

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O2

uint32_t helper_sadd8_aarch64(uint32_t a,uint32_t b,void *gep)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  
  uVar2 = (int)(char)b + (int)(char)a;
  iVar1 = -((int)~uVar2 >> 0x1f);
  uVar4 = (int)(char)(b >> 8) + (int)(char)(a >> 8);
  iVar6 = iVar1 + 2;
  if ((int)uVar4 < 0) {
    iVar6 = iVar1;
  }
  uVar5 = (int)(char)(b >> 0x10) + (int)(char)(a >> 0x10);
  iVar1 = iVar6 + 4;
  if ((int)uVar5 < 0) {
    iVar1 = iVar6;
  }
  iVar6 = ((int)b >> 0x18) + ((int)a >> 0x18);
  iVar3 = iVar1 + 8;
  if (iVar6 < 0) {
    iVar3 = iVar1;
  }
  *(int *)gep = iVar3;
  return iVar6 * 0x1000000 | uVar2 & 0xff | (uVar4 & 0xff) << 8 | (uVar5 & 0xff) << 0x10;
}

Assistant:

uint32_t HELPER(glue(PFX,add8))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD8(a, b, 0);
    ADD8(a >> 8, b >> 8, 1);
    ADD8(a >> 16, b >> 16, 2);
    ADD8(a >> 24, b >> 24, 3);
    SET_GE;
    return res;
}